

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

void __thiscall YdiskRestClient::saveFromUrl(YdiskRestClient *this,string *urlFrom,string *pathTo)

{
  ulong *puVar1;
  Response *pRVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 extraout_RAX;
  Response *pRVar5;
  char *this_00;
  YdiskRestClient *this_01;
  pointer pcVar6;
  undefined8 uVar7;
  Client *this_02;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  ulong *local_c0;
  undefined8 local_b8;
  ulong local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [24];
  undefined1 auStack_88 [16];
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Headers *local_60 [2];
  Headers local_50;
  
  this_00 = "/v1/disk/resources/upload?url=";
  local_60[0] = &local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"/v1/disk/resources/upload?url=","");
  url_encode((string *)((long)&local_50._M_t._M_impl.super__Rb_tree_header._M_header + 8),
             (YdiskRestClient *)this_00,urlFrom);
  this_01 = (YdiskRestClient *)0x15c161;
  plVar3 = (long *)std::__cxx11::string::append
                             ((char *)((long)&local_50._M_t._M_impl.super__Rb_tree_header._M_header
                                      + 8));
  pRVar2 = (Response *)(local_a0 + 0x10);
  pRVar5 = (Response *)(plVar3 + 2);
  if ((Response *)*plVar3 == pRVar5) {
    local_a0._16_8_ = (pRVar5->version)._M_dataplus._M_p;
    auStack_88._0_8_ = plVar3[3];
    local_a0._0_8_ = pRVar2;
  }
  else {
    local_a0._16_8_ = (pRVar5->version)._M_dataplus._M_p;
    local_a0._0_8_ = (Response *)*plVar3;
  }
  local_a0._8_8_ = plVar3[1];
  *plVar3 = (long)pRVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  url_encode((string *)(auStack_88 + 8),this_01,pathTo);
  pcVar6 = (pointer)0xf;
  if ((Response *)local_a0._0_8_ != pRVar2) {
    pcVar6 = (pointer)local_a0._16_8_;
  }
  if (pcVar6 < (pointer)(local_a0._8_8_ + local_78)) {
    uVar7 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_88._8_8_ != &local_70) {
      uVar7 = local_70._M_allocated_capacity;
    }
    if ((pointer)(local_a0._8_8_ + local_78) <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)(auStack_88 + 8),0,(char *)0x0,local_a0._0_8_);
      goto LAB_00140c19;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_a0,auStack_88._8_8_);
LAB_00140c19:
  local_c0 = &local_b0;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_b0 = *puVar1;
    uStack_a8 = puVar4[3];
  }
  else {
    local_b0 = *puVar1;
    local_c0 = (ulong *)*puVar4;
  }
  local_b8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_88._8_8_ != &local_70) {
    operator_delete((void *)auStack_88._8_8_,(ulong)(local_70._M_allocated_capacity + 1));
  }
  if ((Response *)local_a0._0_8_ != pRVar2) {
    operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
  }
  if (local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)((long)&local_50._M_t._M_impl.super__Rb_tree_header._M_header + 0x18U)) {
    operator_delete(local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
                                   ->_M_color + 1));
  }
  local_b8 = 0;
  local_b0 = local_b0 & 0xffffffffffffff00;
  this_02 = (Client *)local_a0;
  local_c0 = &local_b0;
  httplib::Client::Post
            (this_02,(char *)this->http_client,local_60[0],(string *)&this->headers,
             (char *)&local_c0);
  if (((Response *)local_a0._0_8_ != (Response *)0x0) && (*(int *)(local_a0._0_8_ + 0x20) == 0xca))
  {
    wait_success_operation(this,(string *)(local_a0._0_8_ + 0x58));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_60[0] != &local_50) {
      operator_delete(local_60[0],local_50._M_t._M_impl._0_8_ + 1);
    }
    return;
  }
  throw_response_error((YdiskRestClient *)this_02,(Response *)local_a0._0_8_);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_60[0] != &local_50) {
    operator_delete(local_60[0],local_50._M_t._M_impl._0_8_ + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::saveFromUrl(std::string urlFrom, std::string pathTo)
{
    std::string url("/v1/disk/resources/upload?url=");
    url += url_encode(urlFrom) + "&path=" + url_encode(pathTo);
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==202){
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}